

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void testBox(void)

{
  ostream *poVar1;
  char *in_stack_00000040;
  char *in_stack_00000050;
  char *in_stack_00000060;
  char *in_stack_00000070;
  char *in_stack_00000080;
  char *in_stack_00000090;
  char *in_stack_000000a0;
  char *in_stack_000000b0;
  char *in_stack_000000c0;
  char *in_stack_000000d0;
  char *in_stack_000000e0;
  char *in_stack_000000f0;
  char *in_stack_00000100;
  char *in_stack_00000110;
  char *in_stack_00000120;
  char *in_stack_00000130;
  char *in_stack_00000140;
  char *in_stack_00000150;
  char *in_stack_00000160;
  char *in_stack_00000170;
  char *in_stack_00000180;
  char *in_stack_00000190;
  char *in_stack_000001a0;
  char *in_stack_000001b0;
  char *in_stack_000001c0;
  char *in_stack_000001e0;
  char *in_stack_000001f0;
  char *in_stack_00000220;
  char *in_stack_00000240;
  char *in_stack_00000260;
  char *in_stack_00000280;
  char *in_stack_000002d0;
  char *in_stack_00000300;
  char *in_stack_000003c0;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing box methods");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  (anonymous_namespace)::testConstructors<Imath_3_2::Vec2<short>>(in_stack_00000050);
  (anonymous_namespace)::testConstructors<Imath_3_2::Vec2<int>>(in_stack_00000090);
  (anonymous_namespace)::testConstructors<Imath_3_2::Vec2<long>>(in_stack_00000100);
  (anonymous_namespace)::testConstructors<Imath_3_2::Vec2<float>>(in_stack_00000090);
  (anonymous_namespace)::testConstructors<Imath_3_2::Vec2<double>>(in_stack_00000100);
  (anonymous_namespace)::testConstructors<Imath_3_2::Vec3<short>>(in_stack_00000070);
  (anonymous_namespace)::testConstructors<Imath_3_2::Vec3<int>>(in_stack_000000b0);
  (anonymous_namespace)::testConstructors<Imath_3_2::Vec3<long>>(in_stack_00000150);
  (anonymous_namespace)::testConstructors<Imath_3_2::Vec3<float>>(in_stack_000000b0);
  (anonymous_namespace)::testConstructors<Imath_3_2::Vec3<double>>(in_stack_00000150);
  (anonymous_namespace)::testConstructors<Imath_3_2::Vec4<short>>(in_stack_00000080);
  (anonymous_namespace)::testConstructors<Imath_3_2::Vec4<int>>(in_stack_000000e0);
  (anonymous_namespace)::testConstructors<Imath_3_2::Vec4<long>>(in_stack_000001b0);
  (anonymous_namespace)::testConstructors<Imath_3_2::Vec4<float>>(in_stack_000000e0);
  (anonymous_namespace)::testConstructors<Imath_3_2::Vec4<double>>(in_stack_000001b0);
  (anonymous_namespace)::testMakeEmpty<Imath_3_2::Vec2<short>>(in_stack_00000080);
  (anonymous_namespace)::testMakeEmpty<Imath_3_2::Vec2<int>>(in_stack_000000c0);
  (anonymous_namespace)::testMakeEmpty<Imath_3_2::Vec2<long>>(in_stack_00000140);
  (anonymous_namespace)::testMakeEmpty<Imath_3_2::Vec2<float>>(in_stack_000000c0);
  (anonymous_namespace)::testMakeEmpty<Imath_3_2::Vec2<double>>(in_stack_00000140);
  (anonymous_namespace)::testMakeEmpty<Imath_3_2::Vec3<short>>(in_stack_000000a0);
  (anonymous_namespace)::testMakeEmpty<Imath_3_2::Vec3<int>>(in_stack_00000100);
  (anonymous_namespace)::testMakeEmpty<Imath_3_2::Vec3<long>>(in_stack_000001c0);
  (anonymous_namespace)::testMakeEmpty<Imath_3_2::Vec3<float>>(in_stack_00000100);
  (anonymous_namespace)::testMakeEmpty<Imath_3_2::Vec3<double>>(in_stack_000001c0);
  (anonymous_namespace)::testMakeEmpty<Imath_3_2::Vec4<short>>(in_stack_000000c0);
  (anonymous_namespace)::testMakeEmpty<Imath_3_2::Vec4<int>>(in_stack_00000140);
  (anonymous_namespace)::testMakeEmpty<Imath_3_2::Vec4<long>>(in_stack_00000240);
  (anonymous_namespace)::testMakeEmpty<Imath_3_2::Vec4<float>>(in_stack_00000140);
  (anonymous_namespace)::testMakeEmpty<Imath_3_2::Vec4<double>>(in_stack_00000240);
  (anonymous_namespace)::testMakeInfinite<Imath_3_2::Vec2<short>>(in_stack_00000080);
  (anonymous_namespace)::testMakeInfinite<Imath_3_2::Vec2<int>>(in_stack_000000d0);
  (anonymous_namespace)::testMakeInfinite<Imath_3_2::Vec2<long>>(in_stack_00000160);
  (anonymous_namespace)::testMakeInfinite<Imath_3_2::Vec2<float>>(in_stack_000000d0);
  (anonymous_namespace)::testMakeInfinite<Imath_3_2::Vec2<double>>(in_stack_00000160);
  (anonymous_namespace)::testMakeInfinite<Imath_3_2::Vec3<short>>(in_stack_000000b0);
  (anonymous_namespace)::testMakeInfinite<Imath_3_2::Vec3<int>>(in_stack_00000110);
  (anonymous_namespace)::testMakeInfinite<Imath_3_2::Vec3<long>>(in_stack_000001f0);
  (anonymous_namespace)::testMakeInfinite<Imath_3_2::Vec3<float>>(in_stack_00000110);
  (anonymous_namespace)::testMakeInfinite<Imath_3_2::Vec3<double>>(in_stack_000001f0);
  (anonymous_namespace)::testMakeInfinite<Imath_3_2::Vec4<short>>(in_stack_000000d0);
  (anonymous_namespace)::testMakeInfinite<Imath_3_2::Vec4<int>>(in_stack_00000160);
  (anonymous_namespace)::testMakeInfinite<Imath_3_2::Vec4<long>>(in_stack_00000280);
  (anonymous_namespace)::testMakeInfinite<Imath_3_2::Vec4<float>>(in_stack_00000160);
  (anonymous_namespace)::testMakeInfinite<Imath_3_2::Vec4<double>>(in_stack_00000280);
  (anonymous_namespace)::testExtendByPoint<Imath_3_2::Vec2<short>>(in_stack_00000070);
  (anonymous_namespace)::testExtendByPoint<Imath_3_2::Vec2<int>>(in_stack_00000090);
  (anonymous_namespace)::testExtendByPoint<Imath_3_2::Vec2<long>>(in_stack_000000f0);
  (anonymous_namespace)::testExtendByPoint<Imath_3_2::Vec2<float>>(in_stack_00000090);
  (anonymous_namespace)::testExtendByPoint<Imath_3_2::Vec2<double>>(in_stack_000000f0);
  (anonymous_namespace)::testExtendByPoint<Imath_3_2::Vec3<short>>(in_stack_00000080);
  (anonymous_namespace)::testExtendByPoint<Imath_3_2::Vec3<int>>(in_stack_000000b0);
  (anonymous_namespace)::testExtendByPoint<Imath_3_2::Vec3<long>>(in_stack_00000130);
  (anonymous_namespace)::testExtendByPoint<Imath_3_2::Vec3<float>>(in_stack_000000b0);
  (anonymous_namespace)::testExtendByPoint<Imath_3_2::Vec3<double>>(in_stack_00000130);
  (anonymous_namespace)::testExtendByPoint<Imath_3_2::Vec4<short>>(in_stack_00000090);
  (anonymous_namespace)::testExtendByPoint<Imath_3_2::Vec4<int>>(in_stack_000000d0);
  (anonymous_namespace)::testExtendByPoint<Imath_3_2::Vec4<long>>(in_stack_00000170);
  (anonymous_namespace)::testExtendByPoint<Imath_3_2::Vec4<float>>(in_stack_000000d0);
  (anonymous_namespace)::testExtendByPoint<Imath_3_2::Vec4<double>>(in_stack_00000170);
  (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec2<short>>(in_stack_00000110);
  (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec2<int>>(in_stack_00000160);
  (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec2<long>>(in_stack_00000240);
  (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec2<float>>(in_stack_00000160);
  (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec2<double>>(in_stack_00000240);
  (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec3<short>>(in_stack_00000140);
  (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec3<int>>(in_stack_000001c0);
  (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec3<long>>(in_stack_00000300);
  (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec3<float>>(in_stack_000001c0);
  (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec3<double>>(in_stack_00000300);
  (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec4<short>>(in_stack_00000170);
  (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec4<int>>(in_stack_00000220);
  (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec4<long>>(in_stack_000003c0);
  (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec4<float>>(in_stack_00000220);
  (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec4<double>>(in_stack_000003c0);
  (anonymous_namespace)::testComparators<Imath_3_2::Vec2<short>>(in_stack_000000d0);
  (anonymous_namespace)::testComparators<Imath_3_2::Vec2<int>>(in_stack_00000120);
  (anonymous_namespace)::testComparators<Imath_3_2::Vec2<long>>(in_stack_000001c0);
  (anonymous_namespace)::testComparators<Imath_3_2::Vec2<float>>(in_stack_00000120);
  (anonymous_namespace)::testComparators<Imath_3_2::Vec2<double>>(in_stack_000001c0);
  (anonymous_namespace)::testComparators<Imath_3_2::Vec3<short>>(in_stack_000000f0);
  (anonymous_namespace)::testComparators<Imath_3_2::Vec3<int>>(in_stack_00000170);
  (anonymous_namespace)::testComparators<Imath_3_2::Vec3<long>>(in_stack_00000260);
  (anonymous_namespace)::testComparators<Imath_3_2::Vec3<float>>(in_stack_00000170);
  (anonymous_namespace)::testComparators<Imath_3_2::Vec3<double>>(in_stack_00000260);
  (anonymous_namespace)::testComparators<Imath_3_2::Vec4<short>>(in_stack_00000120);
  (anonymous_namespace)::testComparators<Imath_3_2::Vec4<int>>(in_stack_000001c0);
  (anonymous_namespace)::testComparators<Imath_3_2::Vec4<long>>(in_stack_00000300);
  (anonymous_namespace)::testComparators<Imath_3_2::Vec4<float>>(in_stack_000001c0);
  (anonymous_namespace)::testComparators<Imath_3_2::Vec4<double>>(in_stack_00000300);
  (anonymous_namespace)::testSize<Imath_3_2::Vec2<short>>(in_stack_00000060);
  (anonymous_namespace)::testSize<Imath_3_2::Vec2<int>>(in_stack_000000b0);
  (anonymous_namespace)::testSize<Imath_3_2::Vec2<long>>(in_stack_00000170);
  (anonymous_namespace)::testSize<Imath_3_2::Vec2<float>>(in_stack_000000b0);
  (anonymous_namespace)::testSize<Imath_3_2::Vec2<double>>(in_stack_00000170);
  (anonymous_namespace)::testSize<Imath_3_2::Vec3<short>>(in_stack_00000090);
  (anonymous_namespace)::testSize<Imath_3_2::Vec3<int>>(in_stack_00000110);
  (anonymous_namespace)::testSize<Imath_3_2::Vec3<long>>(in_stack_00000220);
  (anonymous_namespace)::testSize<Imath_3_2::Vec3<float>>(in_stack_00000110);
  (anonymous_namespace)::testSize<Imath_3_2::Vec3<double>>(in_stack_00000220);
  (anonymous_namespace)::testSize<Imath_3_2::Vec4<short>>(in_stack_000000b0);
  (anonymous_namespace)::testSize<Imath_3_2::Vec4<int>>(in_stack_00000160);
  (anonymous_namespace)::testSize<Imath_3_2::Vec4<long>>(in_stack_000002d0);
  (anonymous_namespace)::testSize<Imath_3_2::Vec4<float>>(in_stack_00000160);
  (anonymous_namespace)::testSize<Imath_3_2::Vec4<double>>(in_stack_000002d0);
  (anonymous_namespace)::testCenter<Imath_3_2::Vec2<short>>(in_stack_00000060);
  (anonymous_namespace)::testCenter<Imath_3_2::Vec2<int>>(in_stack_000000c0);
  (anonymous_namespace)::testCenter<Imath_3_2::Vec2<long>>(in_stack_00000190);
  (anonymous_namespace)::testCenter<Imath_3_2::Vec2<float>>(in_stack_000000c0);
  (anonymous_namespace)::testCenter<Imath_3_2::Vec2<double>>(in_stack_00000190);
  (anonymous_namespace)::testCenter<Imath_3_2::Vec3<short>>(in_stack_00000090);
  (anonymous_namespace)::testCenter<Imath_3_2::Vec3<int>>(in_stack_00000120);
  (anonymous_namespace)::testCenter<Imath_3_2::Vec3<long>>(in_stack_00000240);
  (anonymous_namespace)::testCenter<Imath_3_2::Vec3<float>>(in_stack_00000120);
  (anonymous_namespace)::testCenter<Imath_3_2::Vec3<double>>(in_stack_00000240);
  (anonymous_namespace)::testCenter<Imath_3_2::Vec4<short>>(in_stack_000000c0);
  (anonymous_namespace)::testCenter<Imath_3_2::Vec4<int>>(in_stack_00000180);
  (anonymous_namespace)::testCenter<Imath_3_2::Vec4<long>>(in_stack_00000300);
  (anonymous_namespace)::testCenter<Imath_3_2::Vec4<float>>(in_stack_00000180);
  (anonymous_namespace)::testCenter<Imath_3_2::Vec4<double>>(in_stack_00000300);
  (anonymous_namespace)::testIsEmpty<Imath_3_2::Vec2<short>>(in_stack_00000040);
  (anonymous_namespace)::testIsEmpty<Imath_3_2::Vec2<int>>(in_stack_00000080);
  (anonymous_namespace)::testIsEmpty<Imath_3_2::Vec2<long>>(in_stack_00000100);
  (anonymous_namespace)::testIsEmpty<Imath_3_2::Vec2<float>>(in_stack_00000080);
  (anonymous_namespace)::testIsEmpty<Imath_3_2::Vec2<double>>(in_stack_00000100);
  (anonymous_namespace)::testIsEmpty<Imath_3_2::Vec3<short>>(in_stack_00000060);
  (anonymous_namespace)::testIsEmpty<Imath_3_2::Vec3<int>>(in_stack_000000b0);
  (anonymous_namespace)::testIsEmpty<Imath_3_2::Vec3<long>>(in_stack_00000170);
  (anonymous_namespace)::testIsEmpty<Imath_3_2::Vec3<float>>(in_stack_000000b0);
  (anonymous_namespace)::testIsEmpty<Imath_3_2::Vec3<double>>(in_stack_00000170);
  (anonymous_namespace)::testIsEmpty<Imath_3_2::Vec4<short>>(in_stack_00000080);
  (anonymous_namespace)::testIsEmpty<Imath_3_2::Vec4<int>>(in_stack_000000f0);
  (anonymous_namespace)::testIsEmpty<Imath_3_2::Vec4<long>>(in_stack_000001e0);
  (anonymous_namespace)::testIsEmpty<Imath_3_2::Vec4<float>>(in_stack_000000f0);
  (anonymous_namespace)::testIsEmpty<Imath_3_2::Vec4<double>>(in_stack_000001e0);
  (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec2<short>>(in_stack_00000040);
  (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec2<int>>(in_stack_00000080);
  (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec2<long>>(in_stack_00000100);
  (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec2<float>>(in_stack_00000080);
  (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec2<double>>(in_stack_00000100);
  (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec3<short>>(in_stack_00000060);
  (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec3<int>>(in_stack_000000b0);
  (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec3<long>>(in_stack_00000170);
  (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec3<float>>(in_stack_000000b0);
  (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec3<double>>(in_stack_00000170);
  (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec4<short>>(in_stack_00000080);
  (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec4<int>>(in_stack_000000f0);
  (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec4<long>>(in_stack_000001e0);
  (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec4<float>>(in_stack_000000f0);
  (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec4<double>>(in_stack_000001e0);
  (anonymous_namespace)::testHasVolume<Imath_3_2::Vec2<short>>(in_stack_00000050);
  (anonymous_namespace)::testHasVolume<Imath_3_2::Vec2<int>>(in_stack_00000090);
  (anonymous_namespace)::testHasVolume<Imath_3_2::Vec2<long>>(in_stack_00000120);
  (anonymous_namespace)::testHasVolume<Imath_3_2::Vec2<float>>(in_stack_00000090);
  (anonymous_namespace)::testHasVolume<Imath_3_2::Vec2<double>>(in_stack_00000120);
  (anonymous_namespace)::testHasVolume<Imath_3_2::Vec3<short>>(in_stack_00000070);
  (anonymous_namespace)::testHasVolume<Imath_3_2::Vec3<int>>(in_stack_000000d0);
  (anonymous_namespace)::testHasVolume<Imath_3_2::Vec3<long>>(in_stack_000001a0);
  (anonymous_namespace)::testHasVolume<Imath_3_2::Vec3<float>>(in_stack_000000d0);
  (anonymous_namespace)::testHasVolume<Imath_3_2::Vec3<double>>(in_stack_000001a0);
  (anonymous_namespace)::testHasVolume<Imath_3_2::Vec4<short>>(in_stack_00000090);
  (anonymous_namespace)::testHasVolume<Imath_3_2::Vec4<int>>(in_stack_00000110);
  (anonymous_namespace)::testHasVolume<Imath_3_2::Vec4<long>>(in_stack_00000220);
  (anonymous_namespace)::testHasVolume<Imath_3_2::Vec4<float>>(in_stack_00000110);
  (anonymous_namespace)::testHasVolume<Imath_3_2::Vec4<double>>(in_stack_00000220);
  (anonymous_namespace)::testMajorAxis<Imath_3_2::Vec2<short>>(in_stack_00000080);
  (anonymous_namespace)::testMajorAxis<Imath_3_2::Vec2<int>>(in_stack_000000b0);
  (anonymous_namespace)::testMajorAxis<Imath_3_2::Vec2<long>>(in_stack_00000110);
  (anonymous_namespace)::testMajorAxis<Imath_3_2::Vec2<float>>(in_stack_000000b0);
  (anonymous_namespace)::testMajorAxis<Imath_3_2::Vec2<double>>(in_stack_00000110);
  (anonymous_namespace)::testMajorAxis<Imath_3_2::Vec3<short>>(in_stack_000000a0);
  (anonymous_namespace)::testMajorAxis<Imath_3_2::Vec3<int>>(in_stack_000000e0);
  (anonymous_namespace)::testMajorAxis<Imath_3_2::Vec3<long>>(in_stack_00000170);
  (anonymous_namespace)::testMajorAxis<Imath_3_2::Vec3<float>>(in_stack_000000e0);
  (anonymous_namespace)::testMajorAxis<Imath_3_2::Vec3<double>>(in_stack_00000170);
  (anonymous_namespace)::testMajorAxis<Imath_3_2::Vec4<short>>(in_stack_000000b0);
  (anonymous_namespace)::testMajorAxis<Imath_3_2::Vec4<int>>(in_stack_00000100);
  (anonymous_namespace)::testMajorAxis<Imath_3_2::Vec4<long>>(in_stack_000001c0);
  (anonymous_namespace)::testMajorAxis<Imath_3_2::Vec4<float>>(in_stack_00000100);
  (anonymous_namespace)::testMajorAxis<Imath_3_2::Vec4<double>>(in_stack_000001c0);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testBox ()
{
    cout << "Testing box methods" << endl;

    //
    // Constructors
    //
    testConstructors<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testConstructors<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testConstructors<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // makeEmpty()
    //
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // makeInfinite()
    //
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // extendBy() (point)
    //
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // extendBy() box
    //
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // == and !==
    //
    testComparators<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testComparators<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testComparators<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testComparators<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testComparators<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testComparators<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testComparators<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testComparators<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testComparators<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testComparators<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testComparators<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testComparators<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testComparators<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testComparators<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testComparators<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // size()
    //
    testSize<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testSize<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testSize<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testSize<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testSize<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testSize<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testSize<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testSize<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testSize<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testSize<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testSize<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testSize<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testSize<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testSize<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testSize<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // center()
    //
    testCenter<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testCenter<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testCenter<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testCenter<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testCenter<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testCenter<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testCenter<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testCenter<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testCenter<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testCenter<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testCenter<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testCenter<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testCenter<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testCenter<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testCenter<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // isEmpty()
    //
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // isInfinite()
    //
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // hasVolume()
    //
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testHasVolume<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testHasVolume<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // majorAxis()
    //
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    cout << "ok\n" << endl;
}